

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_q8_1_ref(float *x,block_q8_1 *y,int64_t k)

{
  ggml_fp16_t gVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar2;
  float fVar3;
  float v1;
  float v0;
  int j_1;
  int sum;
  float id;
  float d;
  float v;
  int j;
  float amax;
  int i;
  int nb;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_3c;
  float in_stack_ffffffffffffffd4;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  
  for (local_20 = 0; local_20 < (int)(in_RDX / 0x20); local_20 = local_20 + 1) {
    local_24 = 0.0;
    for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
      in_stack_ffffffffffffffd4 = *(float *)(in_RDI + (long)(local_20 * 0x20 + local_28) * 4);
      if (local_24 <= ABS(in_stack_ffffffffffffffd4)) {
        local_48 = ABS(in_stack_ffffffffffffffd4);
      }
      else {
        local_48 = local_24;
      }
      local_24 = local_48;
    }
    local_24 = local_24 / 127.0;
    if ((local_24 != 0.0) || (NAN(local_24))) {
      local_4c = 1.0 / local_24;
    }
    else {
      local_4c = 0.0;
    }
    gVar1 = ggml_compute_fp32_to_fp16(in_stack_ffffffffffffffd4);
    *(ggml_fp16_t *)(in_RSI + (long)local_20 * 0x24) = gVar1;
    for (local_3c = 0; local_3c < 0x10; local_3c = local_3c + 1) {
      fVar3 = *(float *)(in_RDI + (long)(local_20 * 0x20 + 0x10 + local_3c) * 4);
      fVar2 = roundf(*(float *)(in_RDI + (long)(local_20 * 0x20 + local_3c) * 4) * local_4c);
      *(char *)((long)local_3c + 4 + in_RSI + (long)local_20 * 0x24) = (char)(int)fVar2;
      fVar3 = roundf(fVar3 * local_4c);
      *(char *)(in_RSI + (long)local_20 * 0x24 + 4 + (long)(local_3c + 0x10)) = (char)(int)fVar3;
    }
    gVar1 = ggml_compute_fp32_to_fp16(in_stack_ffffffffffffffd4);
    *(ggml_fp16_t *)(in_RSI + (long)local_20 * 0x24 + 2) = gVar1;
  }
  return;
}

Assistant:

void quantize_row_q8_1_ref(const float * GGML_RESTRICT x, block_q8_1 * GGML_RESTRICT y, int64_t k) {
    assert(QK8_1 == 32);
    assert(k % QK8_1 == 0);
    const int nb = k / QK8_1;

    for (int i = 0; i < nb; i++) {
        float amax = 0.0f; // absolute max

        for (int j = 0; j < QK8_1; j++) {
            const float v = x[i*QK8_1 + j];
            amax = MAX(amax, fabsf(v));
        }

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        int sum = 0;

        for (int j = 0; j < QK8_1/2; ++j) {
            const float v0 = x[i*QK8_1           + j]*id;
            const float v1 = x[i*QK8_1 + QK8_1/2 + j]*id;

            y[i].qs[          j] = roundf(v0);
            y[i].qs[QK8_1/2 + j] = roundf(v1);

            sum += y[i].qs[          j];
            sum += y[i].qs[QK8_1/2 + j];
        }

        y[i].s = GGML_FP32_TO_FP16(sum*d);
    }
}